

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void EnableCursor(void)

{
  glfwSetInputMode(CORE.Window.handle,0x33001,0x34001);
  CORE.Input.Mouse.cursorHidden = false;
  return;
}

Assistant:

void EnableCursor(void)
{
#if defined(PLATFORM_DESKTOP)
    glfwSetInputMode(CORE.Window.handle, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
#endif
#if defined(PLATFORM_WEB)
    emscripten_exit_pointerlock();
#endif
#if defined(PLATFORM_UWP)
    UWPGetMouseUnlockFunc()();
#endif
    CORE.Input.Mouse.cursorHidden = false;
}